

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringCache.cpp
# Opt level: O0

JavascriptString * __thiscall Js::CharStringCache::GetStringForChar(CharStringCache *this,char16 c)

{
  bool bVar1;
  char c_00;
  JavascriptLibrary *this_00;
  ScriptContext *scriptContext;
  char16 c_local;
  CharStringCache *this_local;
  
  this_00 = JavascriptLibrary::FromCharStringCache(this);
  scriptContext = JavascriptLibrary::GetScriptContext(this_00);
  StringProfiler::RecordSingleCharStringRequest(scriptContext);
  bVar1 = JavascriptString::IsASCII7BitChar(c);
  if (bVar1) {
    c_00 = JavascriptString::ToASCII7BitChar(c);
    this_local = (CharStringCache *)GetStringForCharA(this,c_00);
  }
  else {
    this_local = (CharStringCache *)GetStringForCharW(this,c);
  }
  return (JavascriptString *)this_local;
}

Assistant:

JavascriptString* CharStringCache::GetStringForChar(char16 c)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(GetStringForChar);
#ifdef PROFILE_STRINGS
        StringProfiler::RecordSingleCharStringRequest(JavascriptLibrary::FromCharStringCache(this)->GetScriptContext());
#endif
        if (JavascriptString::IsASCII7BitChar(c))
        {
            return GetStringForCharA(JavascriptString::ToASCII7BitChar(c));
        }

        return GetStringForCharW(c);
        JIT_HELPER_END(GetStringForChar);
    }